

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

int __thiscall Ptex::v2_2::PtexReader::open(PtexReader *this,char *__file,int __oflag,...)

{
  uint uVar1;
  PtexErrorHandler *pPVar2;
  uint64_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  uint64_t uVar6;
  ostream *poVar7;
  long lVar8;
  uint size;
  undefined8 unaff_RBP;
  size_type __new_size;
  allocator<char> aaStack_1d8 [32];
  TempErrorHandler tempErr;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->readlock);
  if (this->_needToOpen != false) {
    std::__cxx11::string::assign((char *)&this->_path);
    iVar4 = (*this->_io->_vptr_PtexInputHandler[2])(this->_io,__file);
    this->_fp = (Handle)CONCAT44(extraout_var,iVar4);
    if ((Handle)CONCAT44(extraout_var,iVar4) == (Handle)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tempErr,"Can\'t open ptex file: ",aaStack_1d8);
      std::__cxx11::string::append((char *)&tempErr);
      std::__cxx11::string::append((char *)&tempErr);
      (*this->_io->_vptr_PtexInputHandler[6])();
      std::__cxx11::string::append((char *)&tempErr);
      std::__cxx11::string::assign((char *)___oflag);
      this->_ok = false;
    }
    else {
      (this->_header).leveldatasize = 0;
      (this->_header).metadatazipsize = 0;
      (this->_header).metadatamemsize = 0;
      (this->_header).faceinfosize = 0;
      (this->_header).constdatasize = 0;
      (this->_header).levelinfosize = 0;
      (this->_header).minorversion = 0;
      (this->_header).alphachan = 0;
      (this->_header).nchannels = 0;
      (this->_header).nlevels = 0;
      (this->_header).nfaces = 0;
      (this->_header).extheadersize = 0;
      (this->_header).magic = 0;
      (this->_header).version = 0;
      (this->_header).meshtype = 0;
      (this->_header).datatype = 0;
      readBlock(this,&this->_header,0x40,true);
      if ((this->_header).magic == 0x78657450) {
        if ((this->_header).version == 1) {
          __new_size = (ulong)(this->_header).nchannels *
                       (long)*(int *)(DataSize(Ptex::v2_2::DataType)::sizes +
                                     (ulong)(this->_header).datatype * 4);
          this->_pixelsize = (int)__new_size;
          std::vector<char,_std::allocator<char>_>::resize(&this->_errorPixel,__new_size);
          tempErr._error._M_dataplus._M_p = (pointer)&tempErr._error.field_2;
          tempErr.super_PtexErrorHandler._vptr_PtexErrorHandler =
               (_func_int **)&PTR__TempErrorHandler_0011fa40;
          tempErr._error._M_string_length = 0;
          tempErr._error.field_2._M_local_buf[0] = '\0';
          pPVar2 = this->_err;
          this->_err = &tempErr.super_PtexErrorHandler;
          (this->_extheader).ubordermode = 0;
          (this->_extheader).pad = 0;
          (this->_extheader).vbordermode = 0;
          (this->_extheader).edgefiltermode = 0;
          (this->_extheader).lmdheaderzipsize = 0;
          (this->_extheader).lmdheadermemsize = 0;
          (this->_extheader).lmddatasize = 0;
          (this->_extheader).editdatasize = 0;
          (this->_extheader).editdatapos = 0;
          uVar1 = (this->_header).extheadersize;
          size = 0x28;
          if (uVar1 < 0x28) {
            size = uVar1;
          }
          readBlock(this,&this->_extheader,size,true);
          uVar1 = (this->_header).faceinfosize;
          uVar5 = (ulong)((this->_header).extheadersize + 0x40);
          this->_faceinfopos = uVar5;
          lVar8 = uVar1 + uVar5;
          this->_constdatapos = lVar8;
          lVar8 = (ulong)(this->_header).constdatasize + lVar8;
          this->_levelinfopos = lVar8;
          lVar8 = (ulong)(this->_header).levelinfosize + lVar8;
          this->_leveldatapos = lVar8;
          lVar8 = lVar8 + (this->_header).leveldatasize;
          this->_metadatapos = lVar8;
          uVar5 = (ulong)(this->_header).metadatazipsize;
          this->_lmdheaderpos = uVar5 + lVar8 + 8;
          lVar8 = (ulong)(this->_extheader).lmdheaderzipsize + lVar8 + uVar5 + 8;
          this->_lmddatapos = lVar8;
          uVar6 = lVar8 + (this->_extheader).lmddatasize;
          uVar3 = (this->_extheader).editdatapos;
          if ((long)uVar6 < (long)uVar3) {
            uVar6 = uVar3;
          }
          this->_editdatapos = uVar6;
          readFaceInfo(this);
          readConstData(this);
          readLevelInfo(this);
          readEditData(this);
          this->_baseMemUsed = this->_memUsed;
          this->_err = pPVar2;
          iVar4 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),this->_ok);
          if (this->_ok == false) {
            std::__cxx11::string::_M_assign(___oflag);
            closeFP(this);
          }
          else {
            this->_needToOpen = false;
          }
          anon_unknown.dwarf_1bae3::TempErrorHandler::~TempErrorHandler(&tempErr);
          goto LAB_0010f057;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&tempErr);
        poVar7 = std::operator<<((ostream *)&tempErr._error._M_string_length,
                                 "Unsupported ptex file version (");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,"): ");
        std::operator<<(poVar7,__file);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=(___oflag,(string *)aaStack_1d8);
        std::__cxx11::string::~string((string *)aaStack_1d8);
        this->_ok = false;
        closeFP(this);
        std::__cxx11::stringstream::~stringstream((stringstream *)&tempErr);
        goto LAB_0010f055;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tempErr,"Not a ptex file: ",aaStack_1d8);
      std::__cxx11::string::append((char *)&tempErr);
      std::__cxx11::string::assign((char *)___oflag);
      this->_ok = false;
      closeFP(this);
    }
    std::__cxx11::string::~string((string *)&tempErr);
  }
LAB_0010f055:
  iVar4 = 0;
LAB_0010f057:
  pthread_mutex_unlock((pthread_mutex_t *)&this->readlock);
  return iVar4;
}

Assistant:

bool PtexReader::open(const char* pathArg, Ptex::String& error)
{
    AutoMutex locker(readlock);
    if (!needToOpen()) return false;

    if (!LittleEndian()) {
        error = "Ptex library doesn't currently support big-endian cpu's";
        return 0;
    }
    _path = pathArg;
    _fp = _io->open(pathArg);
    if (!_fp) {
        std::string errstr = "Can't open ptex file: ";
        errstr += pathArg; errstr += "\n"; errstr += _io->lastError();
        error = errstr.c_str();
        _ok = 0;
        return 0;
    }
    memset(&_header, 0, sizeof(_header));
    readBlock(&_header, HeaderSize);
    if (_header.magic != Magic) {
        std::string errstr = "Not a ptex file: "; errstr += pathArg;
        error = errstr.c_str();
        _ok = 0;
        closeFP();
        return 0;
    }
    if (_header.version != 1) {
        std::stringstream s;
        s << "Unsupported ptex file version ("<< _header.version << "): " << pathArg;
        error = s.str();
        _ok = 0;
        closeFP();
        return 0;
    }
    _pixelsize = _header.pixelSize();
    _errorPixel.resize(_pixelsize);

    // install temp error handler to capture error (to return in error param)
    TempErrorHandler tempErr;
    PtexErrorHandler* prevErr = _err;
    _err = &tempErr;

    // read extended header
    memset(&_extheader, 0, sizeof(_extheader));
    readBlock(&_extheader, PtexUtils::min(uint32_t(ExtHeaderSize), _header.extheadersize));

    // compute offsets of various blocks
    FilePos pos = HeaderSize + _header.extheadersize;
    _faceinfopos = pos;   pos += _header.faceinfosize;
    _constdatapos = pos;  pos += _header.constdatasize;
    _levelinfopos = pos;  pos += _header.levelinfosize;
    _leveldatapos = pos;  pos += _header.leveldatasize;
    _metadatapos = pos;   pos += _header.metadatazipsize;
                          pos += sizeof(uint64_t); // compatibility barrier
    _lmdheaderpos = pos;  pos += _extheader.lmdheaderzipsize;
    _lmddatapos = pos;    pos += _extheader.lmddatasize;

    // edit data may not start immediately if additional sections have been added
    // use value from extheader if present (and > pos)
    _editdatapos = PtexUtils::max(FilePos(_extheader.editdatapos), pos);

    // read basic file info
    readFaceInfo();
    readConstData();
    readLevelInfo();
    readEditData();
    _baseMemUsed = _memUsed;

    // restore error handler
    _err = prevErr;

    // an error occurred while reading the file
    if (!_ok) {
        error = tempErr.getErrorString();
        closeFP();
        return 0;
    }
    AtomicStore(&_needToOpen, false);
    return true;
}